

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

JointObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::GetJointObservationHistoryTree(PlanningUnitMADPDiscrete *this,Index johI)

{
  const_reference ppJVar1;
  ostream *poVar2;
  value_type pJVar3;
  
  if ((ulong)johI < this->_m_nrJointObservationHistories) {
    ppJVar1 = std::
              vector<JointObservationHistoryTree_*,_std::allocator<JointObservationHistoryTree_*>_>
              ::at(&this->_m_jointObservationHistoryTreeVector,(ulong)johI);
    pJVar3 = *ppJVar1;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "PlanningUnitMADPDiscrete::GetJointObservationHistoryTree - Warning: ")
    ;
    poVar2 = std::operator<<(poVar2,"index (");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,")out of bound!");
    std::endl<char,std::char_traits<char>>(poVar2);
    pJVar3 = (JointObservationHistoryTree *)0x0;
  }
  return pJVar3;
}

Assistant:

JointObservationHistoryTree* PlanningUnitMADPDiscrete::
    GetJointObservationHistoryTree(Index johI) const
{
    if(johI < _m_nrJointObservationHistories)
        return(_m_jointObservationHistoryTreeVector.at(johI));
    else
    {
    cerr << "PlanningUnitMADPDiscrete::GetJointObservationHistoryTree - Warning: "<<
        "index (" << johI <<")out of bound!" << endl;
    return(0);
    }
}